

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O2

int __thiscall prmon::monitored_value::set_value(monitored_value *this,mon_value new_value)

{
  ulong __val;
  int iVar1;
  ulong __val_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string s_new_value;
  string s_offset;
  
  __val = this->m_offset;
  __val_00 = new_value - __val;
  if (new_value < __val) {
    std::__cxx11::to_string(&s_offset,__val);
    std::__cxx11::to_string(&s_new_value,new_value);
    std::__cxx11::string::string((string *)&local_110,(string *)this);
    std::operator+(&local_f0,"Error: attempt to set value of ",&local_110);
    std::operator+(&local_d0,&local_f0," to ");
    std::operator+(&local_b0,&local_d0,&s_new_value);
    std::operator+(&local_90,&local_b0,", less than this parameter\'s offset of ");
    std::operator+(&local_70,&local_90,&s_offset);
    spdlog::error<std::__cxx11::string>(&local_70);
LAB_0019a86b:
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&s_new_value);
    std::__cxx11::string::~string((string *)&s_offset);
    iVar1 = 1;
  }
  else {
    if (this->m_monotonic == true) {
      if (__val_00 < this->m_value) {
        std::__cxx11::to_string(&s_offset,__val_00);
        std::__cxx11::to_string(&s_new_value,this->m_value);
        std::__cxx11::string::string((string *)&local_110,(string *)this);
        std::operator+(&local_f0,"Error: attempt to reduce the monitored value of monotonic ",
                       &local_110);
        std::operator+(&local_d0,&local_f0," from ");
        std::operator+(&local_b0,&local_d0,&s_new_value);
        std::operator+(&local_90,&local_b0," to ");
        std::operator+(&local_70,&local_90,&s_offset);
        spdlog::error<std::__cxx11::string>(&local_70);
        goto LAB_0019a86b;
      }
      this->m_value = __val_00;
      this->m_max_value = __val_00;
    }
    else {
      this->m_value = __val_00;
      if (this->m_max_value < __val_00) {
        this->m_max_value = __val_00;
      }
      this->m_summed_value = this->m_summed_value + __val_00;
      this->m_iterations = this->m_iterations + 1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int monitored_value::set_value(mon_value new_value) {
  // If we have an offset for this parameter then passing in
  // a set value less than this is illegal
  if (new_value < m_offset) {
    std::string s_offset = std::to_string(m_offset);
    std::string s_new_value = std::to_string(new_value);
    spdlog::error("Error: attempt to set value of " + m_param.get_name() +
                  " to " + s_new_value +
                  ", less than this parameter's offset of " + s_offset);
    return 1;
  }
  new_value -= m_offset;

  if (m_monotonic) {
    // Monotonic values only increase and never have useful
    // sums or average values based on iterations
    if (new_value < m_value) {
      std::string s_new_value = std::to_string(new_value);
      std::string s_value = std::to_string(m_value);
      spdlog::error(
          "Error: attempt to reduce the monitored value of monotonic " +
          m_param.get_name() + " from " + s_value + " to " + s_new_value);
      return 1;
    }
    m_value = new_value;
    m_max_value = new_value;
  } else {
    // Non-monotonic values can go up and down and have
    // useful average values
    m_value = new_value;
    if (m_value > m_max_value) m_max_value = m_value;
    m_summed_value += m_value;
    ++m_iterations;
  }
  return 0;
}